

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::ParseValue<std::__cxx11::string>(AsciiParser *parser,string *ret,string *err)

{
  bool bVar1;
  ostream *poVar2;
  string local_248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [39];
  allocator local_201;
  string local_200 [32];
  fmt local_1e0 [32];
  ostringstream local_1c0 [8];
  ostringstream ss_e;
  undefined1 local_48 [8];
  string val;
  string *err_local;
  string *ret_local;
  AsciiParser *parser_local;
  
  val.field_2._8_8_ = err;
  ::std::__cxx11::string::string((string *)local_48);
  bVar1 = ascii::AsciiParser::ReadBasicType(parser,(string *)local_48);
  if (bVar1) {
    ::std::__cxx11::string::operator=((string *)ret,(string *)local_48);
    parser_local._7_1_ = true;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = ::std::operator<<((ostream *)local_1c0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa1);
    ::std::operator<<(poVar2," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_200,"Failed to parse a value of type `{}`",&local_201);
    tinyusdz::value::
    TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    type_name();
    fmt::format<std::__cxx11::string>(local_1e0,(string *)local_200,local_228);
    poVar2 = ::std::operator<<((ostream *)local_1c0,(string *)local_1e0);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)local_1e0);
    ::std::__cxx11::string::~string((string *)local_228);
    ::std::__cxx11::string::~string(local_200);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
    if (val.field_2._8_8_ != 0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)val.field_2._8_8_,local_248);
      ::std::__cxx11::string::~string(local_248);
    }
    parser_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  ::std::__cxx11::string::~string((string *)local_48);
  return parser_local._7_1_;
}

Assistant:

bool ParseValue<std::string>(tinyusdz::ascii::AsciiParser &parser,
                             std::string &ret, std::string *err) {
  std::string val;
  if (!parser.ReadBasicType(&val)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to parse a value of type `{}`",
                    value::TypeTraits<std::string>::type_name()));
  }

  ret = val;

  return true;
}